

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

int tcmalloc_backtrace_get_view
              (backtrace_state *state,int descriptor,off_t offset,uint64_t size,
              backtrace_error_callback error_callback,void *data,backtrace_view *view)

{
  __off_t _Var1;
  void *pvVar2;
  ssize_t sVar3;
  int *piVar4;
  ulong uVar5;
  
  _Var1 = lseek(descriptor,offset,0);
  if (_Var1 < 0) {
    piVar4 = __errno_location();
    (*error_callback)(data,"lseek",*piVar4);
  }
  else {
    pvVar2 = tcmalloc_backtrace_alloc(state,size,error_callback,data);
    view->base = pvVar2;
    if (pvVar2 != (void *)0x0) {
      view->data = pvVar2;
      view->len = size;
      uVar5 = 0;
      do {
        if (size < uVar5 || size - uVar5 == 0) {
          return 1;
        }
        sVar3 = read(descriptor,view->base,size - uVar5);
        if (sVar3 < 0) {
          piVar4 = __errno_location();
          (*error_callback)(data,"read",*piVar4);
          tc_free(view->base);
          return 0;
        }
        uVar5 = uVar5 + sVar3;
      } while (sVar3 != 0);
      (*error_callback)(data,"file too short",0);
      tc_free(view->base);
    }
  }
  return 0;
}

Assistant:

int
backtrace_get_view (struct backtrace_state *state, int descriptor,
		    off_t offset, uint64_t size,
		    backtrace_error_callback error_callback,
		    void *data, struct backtrace_view *view)
{
  uint64_t got;
  ssize_t r;

  if ((uint64_t) (size_t) size != size)
    {
      error_callback (data, "file size too large", 0);
      return 0;
    }

  if (lseek (descriptor, offset, SEEK_SET) < 0)
    {
      error_callback (data, "lseek", errno);
      return 0;
    }

  view->base = backtrace_alloc (state, size, error_callback, data);
  if (view->base == NULL)
    return 0;
  view->data = view->base;
  view->len = size;

  got = 0;
  while (got < size)
    {
      r = read (descriptor, view->base, size - got);
      if (r < 0)
	{
	  error_callback (data, "read", errno);
	  free (view->base);
	  return 0;
	}
      if (r == 0)
	break;
      got += (uint64_t) r;
    }

  if (got < size)
    {
      error_callback (data, "file too short", 0);
      free (view->base);
      return 0;
    }

  return 1;
}